

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closefd.c
# Opt level: O0

void nn_closefd(int fd)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  bool bVar5;
  int rc;
  int fd_local;
  
  if ((-1 < fd) && (iVar1 = close(fd), iVar1 != 0)) {
    piVar2 = __errno_location();
    bVar5 = true;
    if (*piVar2 != 4) {
      piVar2 = __errno_location();
      bVar5 = true;
      if (*piVar2 != 0x6e) {
        piVar2 = __errno_location();
        bVar5 = true;
        if (*piVar2 != 0xb) {
          piVar2 = __errno_location();
          bVar5 = true;
          if (*piVar2 != 0x73) {
            piVar2 = __errno_location();
            bVar5 = *piVar2 == 0x68;
          }
        }
      }
    }
    __stream = _stderr;
    if (!bVar5) {
      piVar2 = __errno_location();
      pcVar3 = nn_err_strerror(*piVar2);
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/closefd.c"
              ,0x2a);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_closefd (int fd)
{
    int rc;
    if (nn_slow (fd < 0)) {
        return;
    }
    rc = close (fd);
    if (nn_fast (rc == 0))
        return;
    errno_assert (errno == EINTR || errno == ETIMEDOUT ||
        errno == EWOULDBLOCK || errno == EINPROGRESS || errno == ECONNRESET);
}